

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

double deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::fma
                 (double __x,double __y,double __z)

{
  ShaderType shaderType;
  long lVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  char *__s;
  long *plVar4;
  NotSupportedError *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  NegativeTestContext *in_RDI;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  string shaderSource;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*in_RDI->m_renderCtx->_vptr_RenderContext[2])(SUB84(__x,0));
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar3 = true;
  if (!bVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GL_EXT_gpu_shader5","");
    bVar3 = NegativeTestContext::isExtensionSupported(in_RDI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 == false) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"This test requires a context version 3.2 or higher.",
               "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
               ,0x110f);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"fma","");
  NegativeTestContext::beginSection(in_RDI,(string *)&stack0xffffffffffffff08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  lVar6 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar6);
    bVar3 = NegativeTestContext::isShaderSupported(in_RDI,shaderType);
    if (bVar3) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_d1);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1cbc003);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar5) {
        local_e8._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_e8._8_8_ = plVar4[3];
        _Var7._M_p = (pointer)&local_e8;
      }
      else {
        local_e8._M_allocated_capacity = paVar5->_M_allocated_capacity;
        _Var7._M_p = (pointer)*plVar4;
      }
      lVar1 = plVar4[1];
      *plVar4 = (long)paVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      NegativeTestContext::beginSection(in_RDI,(string *)&stack0xffffffffffffff08);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_e8) {
        operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var7._M_p);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,_Var7._M_p,_Var7._M_p + lVar1);
      verifyShader(in_RDI,shaderType,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_e8) {
        operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,TYPE_INT,TYPE_FLOAT,
                 (DataType)_Var7._M_p);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,_Var7._M_p,_Var7._M_p + lVar1);
      verifyShader(in_RDI,shaderType,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_e8) {
        operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,0x1b,TYPE_FLOAT,TYPE_FLOAT,
                 (DataType)_Var7._M_p);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d0,_Var7._M_p,_Var7._M_p + lVar1);
      verifyShader(in_RDI,shaderType,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_e8) {
        operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
      }
      NegativeTestContext::endSection(in_RDI);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x18);
  NegativeTestContext::endSection(in_RDI);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

void fma (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("fma");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_FLOAT, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_FLOAT, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_INT, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}